

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int base64encode(char *encoded,char *string,int len)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  char *p;
  ulong uVar4;
  ulong uVar5;
  
  iVar3 = (int)encoded;
  uVar2 = 0;
  if (2 < len) {
    uVar2 = 0;
    do {
      *encoded = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(byte)string[uVar2] >> 2];
      encoded[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(uint)((byte)string[uVar2 + 1] >> 4) | ((byte)string[uVar2] & 3) << 4];
      encoded[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(uint)((byte)string[uVar2 + 2] >> 6) + ((byte)string[uVar2 + 1] & 0xf) * 4];
      encoded[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(byte)string[uVar2 + 2] & 0x3f];
      encoded = encoded + 4;
      uVar2 = uVar2 + 3;
    } while (uVar2 < len - 2);
  }
  if ((int)uVar2 < len) {
    uVar4 = uVar2 & 0xffffffff;
    *encoded = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(byte)string[uVar4] >> 2];
    uVar5 = (ulong)(((byte)string[uVar4] & 3) << 4);
    if ((int)uVar2 == len + -1) {
      encoded[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar5];
      cVar1 = '=';
    }
    else {
      encoded[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [uVar5 | (byte)string[uVar4 + 1] >> 4];
      cVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(ulong)((byte)string[uVar4 + 1] & 0xf) * 4];
    }
    encoded[2] = cVar1;
    encoded[3] = '=';
    encoded = encoded + 4;
  }
  *encoded = '\0';
  return ((int)encoded - iVar3) + 1;
}

Assistant:

int base64encode(char *encoded, const char *string, int len)
{
    int i;
    char *p;

    p = encoded;
    for (i = 0; i < len - 2; i += 3)
    {
        *p++ = basis_64[(string[i] >> 2) & 0x3F];
        *p++ = basis_64[((string[i] & 0x3) << 4) |
                        ((int)(string[i + 1] & 0xF0) >> 4)];
        *p++ = basis_64[((string[i + 1] & 0xF) << 2) |
                        ((int)(string[i + 2] & 0xC0) >> 6)];
        *p++ = basis_64[string[i + 2] & 0x3F];
    }
    if (i < len)
    {
        *p++ = basis_64[(string[i] >> 2) & 0x3F];
        if (i == (len - 1))
        {
            *p++ = basis_64[((string[i] & 0x3) << 4)];
            *p++ = '=';
        }
        else
        {
            *p++ = basis_64[((string[i] & 0x3) << 4) |
                            ((int)(string[i + 1] & 0xF0) >> 4)];
            *p++ = basis_64[((string[i + 1] & 0xF) << 2)];
        }
        *p++ = '=';
    }

    *p++ = '\0';
    return p - encoded;
}